

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

int array_negation_range_test(int r_start,int r_end,_Bool is_bitset)

{
  ushort uVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int extraout_EAX;
  array_container_t *container;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  uint8_t typecode;
  ulong unaff_R15;
  bool bVar9;
  uint uVar10;
  int iVar12;
  int iVar13;
  undefined1 auVar11 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar23;
  uint uVar24;
  undefined1 auVar22 [16];
  uint uVar25;
  container_t *BO;
  int *local_38;
  
  container = array_container_create();
  uVar10 = 0;
  do {
    iVar4 = container->cardinality;
    uVar7 = (ushort)uVar10;
    if (((long)iVar4 == 0) ||
       ((iVar4 != 0x7fffffff && (container->array[(long)iVar4 + -1] < uVar7)))) {
      if (iVar4 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      iVar4 = container->cardinality;
      container->cardinality = iVar4 + 1;
      container->array[iVar4] = uVar7;
    }
    else {
      iVar14 = iVar4 + -1;
      uVar6 = 0;
      do {
        if (iVar14 < (int)uVar6) {
          unaff_R15 = (ulong)~uVar6;
          break;
        }
        uVar5 = uVar6 + iVar14 >> 1;
        uVar1 = *(ushort *)((long)container->array + (ulong)(uVar6 + iVar14 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar6 = uVar5 + 1;
          bVar9 = true;
        }
        else if (uVar7 < uVar1) {
          iVar14 = uVar5 - 1;
          bVar9 = true;
        }
        else {
          bVar9 = false;
          unaff_R15 = (ulong)uVar5;
        }
      } while (bVar9);
      if ((iVar4 != 0x7fffffff) && ((int)(uint)unaff_R15 < 0)) {
        if (iVar4 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar6 = ~(uint)unaff_R15;
        unaff_R15 = (ulong)uVar6;
        memmove(container->array + unaff_R15 + 1,container->array + unaff_R15,
                (long)(int)(iVar4 - uVar6) * 2);
        container->array[unaff_R15] = uVar7;
        container->cardinality = container->cardinality + 1;
      }
    }
    bVar9 = 0xffe2 < uVar10;
    uVar10 = uVar10 + 0x1d;
    if (bVar9) {
      iVar4 = 0x10000;
      iVar14 = 0;
      iVar15 = 0;
      iVar16 = 0;
      iVar17 = 0;
      auVar11 = _DAT_001201c0;
      do {
        uVar10 = auVar11._0_4_;
        uVar6 = auVar11._4_4_;
        iVar12 = auVar11._8_4_;
        iVar13 = auVar11._12_4_;
        uVar5 = -(uint)((int)uVar10 < r_end) ^ 0xffffffff | -(uint)((int)uVar10 < r_start);
        uVar18 = -(uint)((int)uVar6 < r_end) ^ 0xffffffff | -(uint)((int)uVar6 < r_start);
        uVar19 = -(uint)(iVar12 < r_end) ^ 0xffffffff | -(uint)(iVar12 < r_start);
        uVar20 = -(uint)(iVar13 < r_end) ^ 0xffffffff | -(uint)(iVar13 < r_start);
        auVar22._4_4_ = uVar6;
        auVar22._0_4_ = uVar6;
        auVar22._8_4_ = iVar13;
        auVar22._12_4_ = iVar13;
        uVar21 = -(uint)(uVar10 == (uVar10 / 0x1d) * 0x1d);
        uVar23 = -(uint)(uVar6 == (uVar6 / 0x1d) * 0x1d);
        uVar24 = -(uint)(iVar12 == (int)(((auVar11._8_8_ & 0xffffffff) / 0x1d) * 0x1d));
        uVar25 = -(uint)(iVar13 == (int)(((auVar22._8_8_ & 0xffffffff) / 0x1d) * 0x1d));
        iVar14 = iVar14 - ((uVar21 | uVar5) ^ 0xffffffff | uVar21 & uVar5);
        iVar15 = iVar15 - ((uVar23 | uVar18) ^ 0xffffffff | uVar23 & uVar18);
        iVar16 = iVar16 - ((uVar24 | uVar19) ^ 0xffffffff | uVar24 & uVar19);
        iVar17 = iVar17 - ((uVar25 | uVar20) ^ 0xffffffff | uVar25 & uVar20);
        auVar11._0_4_ = uVar10 + 4;
        auVar11._4_4_ = uVar6 + 4;
        auVar11._8_4_ = iVar12 + 4;
        auVar11._12_4_ = iVar13 + 4;
        iVar4 = iVar4 + -4;
      } while (iVar4 != 0);
      _Var2 = array_container_negation_range(container,r_start,r_end,&local_38);
      typecode = '\x02' - _Var2;
      iVar4 = *local_38;
      _assert_int_equal((ulong)is_bitset,(ulong)_Var2,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x596);
      _assert_int_equal((ulong)(uint)(iVar17 + iVar15 + iVar16 + iVar14),(long)iVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x597);
      uVar8 = 0;
      do {
        iVar14 = (int)uVar8;
        iVar4 = (int)(uVar8 / 0x1d) * 2 + (int)(uVar8 / 0x1d) * 0x1b;
        if (iVar14 < r_end && r_start <= iVar14) {
          _Var2 = iVar4 != iVar14;
        }
        else {
          _Var2 = iVar4 == iVar14;
        }
        _Var3 = container_contains(local_38,(uint16_t)uVar8,typecode);
        if (_Var2 != _Var3) {
          printf("oops on %d\n",uVar8);
        }
        _Var3 = container_contains(local_38,(uint16_t)uVar8,typecode);
        _assert_int_equal((ulong)_Var3,(ulong)_Var2,
                          "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                          ,0x5a6);
        uVar8 = (ulong)(iVar14 + 1U);
      } while (iVar14 + 1U != 0x10000);
      container_free(local_38,typecode);
      array_container_free(container);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

static int array_negation_range_test(int r_start, int r_end, bool is_bitset) {
    bool result_is_bitset;
    int result_size_should_be = 0;

    array_container_t* AI = array_container_create();
    container_t* BO;  // bitset or array

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x >= r_start && x < r_end)
            if (x % 29 != 0)
                result_size_should_be++;
            else {
            }
        else if (x % 29 == 0)
            result_size_should_be++;
    }

    result_is_bitset = array_container_negation_range(AI, r_start, r_end, &BO);
    uint8_t result_typecode =
        (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);

    int result_card = container_get_cardinality(BO, result_typecode);

    assert_int_equal(is_bitset, result_is_bitset);
    assert_int_equal(result_size_should_be, result_card);

    for (int x = 0; x < (1 << 16); x++) {
        bool should_be_present;
        if (x >= r_start && x < r_end)
            should_be_present = (x % 29 != 0);
        else
            should_be_present = (x % 29 == 0);

#ifndef UNVERBOSE_MIXED_CONTAINER
        if (should_be_present !=
            container_contains(BO, (uint16_t)x, result_typecode))
            printf("oops on %d\n", x);
#endif
        assert_int_equal(container_contains(BO, (uint16_t)x, result_typecode),
                         should_be_present);
    }
    container_free(BO, result_typecode);
    array_container_free(AI);
    return 1;
}